

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_dist.hpp
# Opt level: O2

result_type_conflict1 __thiscall
trng::normal_dist<float>::pdf(normal_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  float fVar2;
  
  fVar2 = x - (this->P).mu_;
  fVar1 = (this->P).sigma_;
  fVar2 = expf((fVar2 * fVar2) / (fVar1 * -2.0 * fVar1));
  return fVar2 * (0.3989423 / fVar1);
}

Assistant:

pdf(result_type x) const {
      const result_type t{x - P.mu()};
      return math::constants<result_type>::one_over_sqrt_2pi / P.sigma() *
             math::exp(t * t / (-2 * P.sigma() * P.sigma()));
    }